

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_source_over(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int local_30;
  uint32_t s_1;
  int i_1;
  uint32_t s;
  int i;
  uint32_t const_alpha_local;
  uint32_t *src_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
      uVar1 = src[i_1];
      if (uVar1 < 0xff000000) {
        if (uVar1 != 0) {
          uVar2 = BYTE_MUL(dest[i_1],(uVar1 ^ 0xffffffff) >> 0x18);
          dest[i_1] = uVar1 + uVar2;
        }
      }
      else {
        dest[i_1] = uVar1;
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
      uVar2 = BYTE_MUL(src[local_30],const_alpha);
      uVar3 = BYTE_MUL(dest[local_30],(uVar2 ^ 0xffffffff) >> 0x18);
      dest[local_30] = uVar2 + uVar3;
    }
  }
  return;
}

Assistant:

static void composition_source_over(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t s = src[i];
            if(s >= 0xff000000) {
                dest[i] = s;
            } else if (s != 0) {
                dest[i] = s + BYTE_MUL(dest[i], plutovg_alpha(~s));
            }
        }
    } else {
        for(int i = 0; i < length; i++) {
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            dest[i] = s + BYTE_MUL(dest[i], plutovg_alpha(~s));
        }
    }
}